

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void listFiles(string *dirName,
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *f)

{
  char cVar1;
  undefined8 uVar2;
  path local_60;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_60,dirName);
  cVar1 = std::experimental::filesystem::v1::status(&local_60);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_60);
  if (cVar1 == '\x02') {
    _listFiles(dirName,f);
  }
  else {
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      std::experimental::filesystem::v1::__cxx11::path::~path(&local_60);
      _Unwind_Resume(uVar2);
    }
    (*f->_M_invoker)((_Any_data *)f,dirName);
  }
  return;
}

Assistant:

void listFiles(const std::string& dirName,
               const std::function<void(const std::string& path)>& f)
{
    if (!fs::is_directory(dirName)) {
        f(dirName);
        return;
    }
    _listFiles(dirName, f);
}